

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_fxadd(sexp ctx,sexp a,sexp_uint_t b)

{
  ulong uVar1;
  sexp_uint_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = sexp_bignum_hi(a);
  uVar3 = 1;
  do {
    uVar1 = *(ulong *)((long)&a->value + uVar3 * 8 + 8);
    *(ulong *)((long)&a->value + uVar3 * 8 + 8) = uVar1 + b;
    uVar4 = ~b;
    if (sVar2 <= uVar3) break;
    b = (sexp_uint_t)(uVar4 < uVar1);
    uVar3 = uVar3 + 1;
  } while (uVar4 < uVar1);
  if (uVar4 < uVar1) {
    a = sexp_copy_bignum(ctx,(sexp)0x0,a,sVar2 + 1);
    *(undefined8 *)((long)&a->value + sVar2 * 8 + 0x10) = 1;
  }
  return a;
}

Assistant:

sexp sexp_bignum_fxadd (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a),
    carry=b, i=0, n;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
  if (carry) {
    a = sexp_copy_bignum(ctx, NULL, a, len+1);
    sexp_bignum_data(a)[len] = 1;
  }
  return a;
}